

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::IsGroupOf_PDU::Encode(IsGroupOf_PDU *this,KDataStream *stream)

{
  long lVar1;
  pointer pKVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_GroupedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_GroupedEntityID,stream);
  KDataStream::Write(stream,this->m_ui8GrpdEntCat);
  KDataStream::Write(stream,this->m_ui8NumOfGroupedEnts);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding1);
  KDataStream::Write<double>(stream,(double)this->m_f64GrpLat);
  KDataStream::Write<double>(stream,(double)this->m_f64GrpLon);
  pKVar2 = (this->m_vpGED).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vpGED).
      super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pKVar2) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      (*((pKVar2[uVar3].m_pRef)->super_DataTypeBase)._vptr_DataTypeBase[5])
                (pKVar2[uVar3].m_pRef,stream);
      pKVar2 = (this->m_vpGED).
               super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->m_vpGED).
                     super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar2 >> 3) *
              -0x5555555555555555;
      bVar5 = uVar4 <= uVar3;
      lVar1 = uVar3 - uVar4;
      uVar3 = uVar4;
      uVar4 = (ulong)(byte)((char)uVar4 + 1);
    } while (bVar5 && lVar1 != 0);
  }
  return;
}

Assistant:

void IsGroupOf_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_GroupedEntityID
           << m_ui8GrpdEntCat
           << m_ui8NumOfGroupedEnts
           << m_ui32Padding1
           << m_f64GrpLat
           << m_f64GrpLon;

    KUINT8 i = 0;

    while( i < m_vpGED.size() )
    {
        m_vpGED[i]->Encode( stream );
        ++i;
    }
}